

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O0

void show_equip(wchar_t mode,item_tester tester)

{
  wchar_t local_24;
  wchar_t last_slot;
  _Bool in_term;
  wchar_t i;
  item_tester tester_local;
  wchar_t mode_local;
  
  wipe_obj_list();
  build_obj_list((uint)(player->body).count + L'\xffffffff',(object **)0x0,tester,mode);
  if ((mode & 1U) != 0) {
    local_24 = L'\xffffffff';
    strnfmt(items[num_obj].label,0x50,"In quiver");
    items[num_obj].object = (object *)0x0;
    num_obj = num_obj + L'\x01';
    for (last_slot = L'\0'; last_slot < (int)(uint)z_info->quiver_size;
        last_slot = last_slot + L'\x01') {
      if (player->upkeep->quiver[last_slot] != (object *)0x0) {
        local_24 = last_slot;
      }
    }
    build_obj_list(local_24,player->upkeep->quiver,tester,mode);
  }
  num_head = L'\0';
  show_obj_list(mode);
  return;
}

Assistant:

void show_equip(int mode, item_tester tester)
{
	int i;
	bool in_term = (mode & OLIST_WINDOW) ? true : false;

	/* Initialize */
	wipe_obj_list();

	/* Build the object list */
	build_obj_list(player->body.count - 1, NULL, tester, mode);

	/* Show the quiver in subwindows */
	if (in_term) {
		int last_slot = -1;

		strnfmt(items[num_obj].label, sizeof(items[num_obj].label),
				"In quiver");
		items[num_obj].object = NULL;
		num_obj++;

		/* Find the last occupied quiver slot */
		for (i = 0; i < z_info->quiver_size; i++)
			if (player->upkeep->quiver[i] != NULL) last_slot = i;

		/* Extend the object list */
		build_obj_list(last_slot, player->upkeep->quiver, tester, mode);
	}

	/* Display the object list */
	num_head = 0;
	show_obj_list(mode);
}